

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

char ** build_envp(JSContext *ctx,JSValue obj)

{
  JSValue this_obj;
  int iVar1;
  char **ptr;
  char *__s;
  char *__s_00;
  size_t __n;
  size_t __n_00;
  char *__dest;
  JSRefCountHeader *p;
  ulong uVar2;
  JSValue JVar3;
  uint32_t len;
  JSPropertyEnum *tab;
  uint local_64;
  JSPropertyEnum *local_60;
  char **local_58;
  JSValueUnion local_50;
  int64_t local_48;
  char *local_40;
  ulong local_38;
  
  local_48 = obj.tag;
  local_50 = obj.u;
  iVar1 = JS_GetOwnPropertyNames(ctx,&local_60,&local_64,obj,0x11);
  if (iVar1 < 0) {
    return (char **)0x0;
  }
  ptr = (char **)js_mallocz(ctx,(ulong)local_64 * 8 + 8);
  if (ptr == (char **)0x0) {
    ptr = (char **)0x0;
  }
  else {
    if (local_64 == 0) goto LAB_001147fe;
    uVar2 = 0;
    local_58 = ptr;
    do {
      this_obj.tag = local_48;
      this_obj.u.ptr = local_50.ptr;
      JVar3.tag = local_48;
      JVar3.u.ptr = local_50.ptr;
      JVar3 = JS_GetPropertyInternal(ctx,JVar3,local_60[uVar2].atom,this_obj,0);
      if ((uint)JVar3.tag == 6) {
LAB_001147a5:
        if (local_64 != 0) {
          uVar2 = 0;
          do {
            js_free(ctx,ptr[uVar2]);
            uVar2 = uVar2 + 1;
          } while (uVar2 < local_64);
        }
        js_free(ctx,ptr);
        ptr = (char **)0x0;
        break;
      }
      __s = JS_ToCStringLen2(ctx,(size_t *)0x0,JVar3,0);
      if ((0xfffffff4 < (uint)JVar3.tag) &&
         (iVar1 = *JVar3.u.ptr, *(int *)JVar3.u.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValue(ctx,JVar3);
      }
      if (__s == (char *)0x0) goto LAB_001147a5;
      __s_00 = JS_AtomToCString(ctx,local_60[uVar2].atom);
      if (__s_00 == (char *)0x0) {
LAB_0011479a:
        JS_FreeCString(ctx,__s);
        goto LAB_001147a5;
      }
      local_38 = uVar2;
      __n = strlen(__s_00);
      __n_00 = strlen(__s);
      __dest = (char *)js_malloc(ctx,__n + __n_00 + 2);
      if (__dest == (char *)0x0) {
        JS_FreeCString(ctx,__s_00);
        ptr = local_58;
        goto LAB_0011479a;
      }
      memcpy(__dest,__s_00,__n);
      local_40 = __dest + __n;
      __dest[__n] = '=';
      memcpy(__dest + __n + 1,__s,__n_00);
      uVar2 = local_38;
      ptr = local_58;
      local_40[__n_00 + 1] = '\0';
      local_58[local_38] = __dest;
      JS_FreeCString(ctx,__s_00);
      JS_FreeCString(ctx,__s);
      uVar2 = uVar2 + 1;
    } while (uVar2 < local_64);
  }
  if (local_64 != 0) {
    uVar2 = 0;
    do {
      JS_FreeAtom(ctx,local_60[uVar2].atom);
      uVar2 = uVar2 + 1;
    } while (uVar2 < local_64);
  }
LAB_001147fe:
  js_free(ctx,local_60);
  return ptr;
}

Assistant:

static char **build_envp(JSContext *ctx, JSValueConst obj)
{
    uint32_t len, i;
    JSPropertyEnum *tab;
    char **envp, *pair;
    const char *key, *str;
    JSValue val;
    size_t key_len, str_len;
    
    if (JS_GetOwnPropertyNames(ctx, &tab, &len, obj,
                               JS_GPN_STRING_MASK | JS_GPN_ENUM_ONLY) < 0)
        return NULL;
    envp = js_mallocz(ctx, sizeof(envp[0]) * ((size_t)len + 1));
    if (!envp)
        goto fail;
    for(i = 0; i < len; i++) {
        val = JS_GetProperty(ctx, obj, tab[i].atom);
        if (JS_IsException(val))
            goto fail;
        str = JS_ToCString(ctx, val);
        JS_FreeValue(ctx, val);
        if (!str)
            goto fail;
        key = JS_AtomToCString(ctx, tab[i].atom);
        if (!key) {
            JS_FreeCString(ctx, str);
            goto fail;
        }
        key_len = strlen(key);
        str_len = strlen(str);
        pair = js_malloc(ctx, key_len + str_len + 2);
        if (!pair) {
            JS_FreeCString(ctx, key);
            JS_FreeCString(ctx, str);
            goto fail;
        }
        memcpy(pair, key, key_len);
        pair[key_len] = '=';
        memcpy(pair + key_len + 1, str, str_len);
        pair[key_len + 1 + str_len] = '\0';
        envp[i] = pair;
        JS_FreeCString(ctx, key);
        JS_FreeCString(ctx, str);
    }
 done:
    for(i = 0; i < len; i++)
        JS_FreeAtom(ctx, tab[i].atom);
    js_free(ctx, tab);
    return envp;
 fail:
    if (envp) {
        for(i = 0; i < len; i++)
            js_free(ctx, envp[i]);
        js_free(ctx, envp);
        envp = NULL;
    }
    goto done;
}